

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackInterpreter.cpp
# Opt level: O1

void __thiscall Lodtalk::StackInterpreter::interpretPushThisContext(StackInterpreter *this)

{
  StackMemory *pSVar1;
  size_t sVar2;
  uint8_t *puVar3;
  undefined8 uVar4;
  
  pSVar1 = this->stack;
  sVar2 = this->pc;
  this->pc = sVar2 + 1;
  this->nextOpcode =
       (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                              super_SequenceableCollection.super_Collection.super_Object.
                              super_ProtoObject.object_header_ + sVar2);
  if ((pSVar1->stackFrame).framePointer[-0xe] == '\0') {
    StackFrame::marryFrame(&pSVar1->stackFrame,pSVar1->context);
  }
  pSVar1 = this->stack;
  puVar3 = (pSVar1->stackFrame).stackPointer;
  uVar4 = *(undefined8 *)((pSVar1->stackFrame).framePointer + -0x18);
  (pSVar1->stackFrame).stackPointer = puVar3 + -8;
  *(undefined8 *)(puVar3 + -8) = uVar4;
  return;
}

Assistant:

void interpretPushThisContext()
	{
        fetchNextInstructionOpcode();

        // Ensure my frame is married.
        stack->ensureFrameIsMarried();

        pushOop(stack->getThisContext());
	}